

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O0

Mesh * vera::sphereHalfMesh(Mesh *__return_storage_ptr__,int _resolution,float _radius)

{
  float fVar1;
  float fVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  float local_8c;
  float local_88;
  float ix;
  float iy;
  int index3;
  int index2;
  int index1;
  int nr;
  float local_68;
  float nz;
  float local_54;
  float local_50;
  float nx;
  float j;
  float ny;
  float tr;
  float i;
  vec2 tcoord;
  vec3 vert;
  float azimInc;
  float polarInc;
  float doubleRes;
  float halfRes;
  float _radius_local;
  int _resolution_local;
  Mesh *mesh;
  
  Mesh::Mesh(__return_storage_ptr__);
  fVar5 = (float)_resolution * 2.0;
  fVar4 = (float)_resolution * 0.5;
  for (ny = fVar4; ny < (float)(_resolution + 1); ny = ny + 1.0) {
    dVar6 = sin(3.141592653589793 - (double)(ny * (3.1415927 / (float)_resolution)));
    j = (float)dVar6;
    dVar6 = cos(3.141592653589793 - (double)(ny * (3.1415927 / (float)_resolution)));
    nx = (float)dVar6;
    i = 1.0 - ny / (float)_resolution;
    for (local_50 = 0.0; fVar1 = j, local_50 <= fVar5; local_50 = local_50 + 1.0) {
      dVar6 = std::sin((double)(ulong)(uint)(local_50 * (6.2831855 / fVar5)));
      fVar2 = j;
      local_54 = fVar1 * SUB84(dVar6,0);
      dVar6 = std::cos((double)(ulong)(uint)(local_50 * (6.2831855 / fVar5)));
      local_68 = fVar2 * SUB84(dVar6,0);
      tr = local_50 / fVar5;
      glm::vec<3,_float,_(glm::qualifier)0>::vec
                ((vec<3,_float,_(glm::qualifier)0> *)&index1,local_54,nx,local_68);
      tcoord = _index1;
      Mesh::addNormal(__return_storage_ptr__,(vec3 *)&tcoord);
      glm::vec<3,float,(glm::qualifier)0>::operator*=
                ((vec<3,float,(glm::qualifier)0> *)&tcoord,_radius);
      Mesh::addVertex(__return_storage_ptr__,(vec3 *)&tcoord);
      Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&tr);
    }
  }
  iVar3 = (int)(fVar5 + 1.0);
  for (local_88 = fVar4; local_88 < (float)_resolution; local_88 = local_88 + 1.0) {
    for (local_8c = 0.0; local_8c < fVar5; local_8c = local_8c + 1.0) {
      if (0.0 < local_88) {
        Mesh::addIndex(__return_storage_ptr__,
                       (int)(((local_88 + 0.0) - fVar4) * (float)iVar3 + local_8c + 0.0));
        Mesh::addIndex(__return_storage_ptr__,
                       (int)(((local_88 + 0.0) - fVar4) * (float)iVar3 + local_8c + 1.0));
        Mesh::addIndex(__return_storage_ptr__,
                       (int)(((local_88 + 1.0) - fVar4) * (float)iVar3 + local_8c + 0.0));
      }
      if (local_88 < (float)(_resolution + -1)) {
        Mesh::addIndex(__return_storage_ptr__,
                       (int)(((local_88 + 0.0) - fVar4) * (float)iVar3 + local_8c + 1.0));
        Mesh::addIndex(__return_storage_ptr__,
                       (int)(((local_88 + 1.0) - fVar4) * (float)iVar3 + local_8c + 1.0));
        Mesh::addIndex(__return_storage_ptr__,
                       (int)(((local_88 + 1.0) - fVar4) * (float)iVar3 + local_8c + 0.0));
      }
    }
  }
  Mesh::computeTangents(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Mesh sphereHalfMesh(int _resolution, float _radius ) {
    Mesh mesh;

    float halfRes = _resolution*.5f;
    float doubleRes = _resolution*2.f;
    float polarInc = PI/(_resolution); // ringAngle
    float azimInc = TAU/(doubleRes); // segAngle //
    
    glm::vec3 vert;
    glm::vec2 tcoord;

    for (float i = halfRes; i < _resolution + 1; i++) {
        float tr = sin( PI-i * polarInc);
        float ny = cos( PI-i * polarInc);
        tcoord.y = 1.f - (i / _resolution);

        for (float j = 0; j <= doubleRes; j++) {

            float nx = tr * sin(j * azimInc);
            float nz = tr * cos(j * azimInc);

            tcoord.x = j / (doubleRes);

            vert = {nx, ny, nz};
            mesh.addNormal(vert);

            vert *= _radius;
            mesh.addVertex(vert);
            mesh.addTexCoord(tcoord);
        }
    }

    int nr = doubleRes+1;
    
    int index1, index2, index3;
    for (float iy = halfRes; iy < _resolution; iy++) {
        for (float ix = 0; ix < doubleRes; ix++) {

            // first tri //
            if (iy > 0) {
                index1 = (iy+0-halfRes) * (nr) + (ix+0);
                index2 = (iy+0-halfRes) * (nr) + (ix+1);
                index3 = (iy+1-halfRes) * (nr) + (ix+0);

                mesh.addIndex(index1);
                mesh.addIndex(index2);
                mesh.addIndex(index3);
            }

            if (iy < _resolution - 1 ) {
                // second tri //
                index1 = (iy+0-halfRes) * (nr) + (ix+1);
                index2 = (iy+1-halfRes) * (nr) + (ix+1);
                index3 = (iy+1-halfRes) * (nr) + (ix+0);

                mesh.addIndex(index1);
                mesh.addIndex(index2);
                mesh.addIndex(index3);

            }
        }
    }
    mesh.computeTangents();

    return mesh;
}